

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Export>::setCapacity
          (Vector<capnp::_::RpcSystemBase::RpcConnectionState::Export> *this,size_t newSize)

{
  long lVar1;
  ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Export> newBuilder;
  
  lVar1 = (long)(this->builder).pos - (long)(this->builder).ptr;
  if (newSize < (ulong)(lVar1 / 0x38)) {
    ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Export>::truncate
              (&this->builder,(char *)newSize,lVar1 % 0x38);
  }
  newBuilder.ptr =
       kj::_::HeapArrayDisposer::
       allocateUninitialized<capnp::_::RpcSystemBase::RpcConnectionState::Export>(newSize);
  newBuilder.endPtr = newBuilder.ptr + newSize;
  newBuilder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  newBuilder.pos = newBuilder.ptr;
  ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Export>::
  addAll<kj::ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Export>>
            (&newBuilder,&this->builder);
  ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Export>::operator=
            (&this->builder,&newBuilder);
  ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Export>::dispose(&newBuilder);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }